

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O1

OpacityNode * __thiscall
rengine::AllocationPool<rengine::OpacityNode>::allocate(AllocationPool<rengine::OpacityNode> *this)

{
  Node **ppNVar1;
  uint uVar2;
  OpacityNode *pOVar3;
  uint *puVar4;
  
  uVar2 = this->m_nextFree;
  if (this->m_poolSize <= uVar2) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::OpacityNode>::allocate() [T = rengine::OpacityNode]"
                 );
  }
  pOVar3 = this->m_memory;
  if (pOVar3 == (OpacityNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::OpacityNode>::allocate() [T = rengine::OpacityNode]"
                 );
  }
  puVar4 = this->m_free;
  if (puVar4 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::OpacityNode>::allocate() [T = rengine::OpacityNode]"
                 );
  }
  if (puVar4[uVar2] < this->m_poolSize) {
    this->m_nextFree = uVar2 + 1;
    uVar2 = puVar4[uVar2];
    pOVar3[uVar2].super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    ppNVar1 = &pOVar3[uVar2].super_Node.m_parent;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppNVar1 = &pOVar3[uVar2].super_Node.m_next;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    *(uint *)&pOVar3[uVar2].super_Node.field_0x30 =
         *(uint *)&pOVar3[uVar2].super_Node.field_0x30 & 0xfffff800 | 2;
    pOVar3[uVar2].super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_0012dbf8;
    *(undefined4 *)&pOVar3[uVar2].super_Node.field_0x34 = 0x3f800000;
    return pOVar3 + uVar2;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::OpacityNode>::allocate() [T = rengine::OpacityNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }